

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_addrinfo2hostent.c
# Opt level: O0

size_t ai_naddr(ares_addrinfo *ai,int af)

{
  size_t local_28;
  size_t i;
  ares_addrinfo_node *node;
  int af_local;
  ares_addrinfo *ai_local;
  
  local_28 = 0;
  for (i = (size_t)ai->nodes; i != 0; i = *(size_t *)(i + 0x20)) {
    if ((af == 0) || (af == *(int *)(i + 8))) {
      local_28 = local_28 + 1;
    }
  }
  return local_28;
}

Assistant:

static size_t ai_naddr(const struct ares_addrinfo *ai, int af)
{
  const struct ares_addrinfo_node *node;
  size_t                           i     = 0;

  for (node = ai->nodes; node != NULL; node=node->ai_next) {
    if (af != AF_UNSPEC && af != node->ai_family)
      continue;
    i++;
  }

  return i;
}